

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status hrgls_DataBlobSourceDestroy(hrgls_DataBlobSource stream)

{
  DataBlobSource *this;
  hrgls_Status local_14;
  hrgls_Status s;
  hrgls_DataBlobSource stream_local;
  
  local_14 = 0;
  if (stream == (hrgls_DataBlobSource)0x0) {
    local_14 = 0x3ec;
  }
  else {
    if (stream->stream == (DataBlobSource *)0x0) {
      local_14 = 0x3ec;
    }
    else {
      this = stream->stream;
      if (this != (DataBlobSource *)0x0) {
        hrgls::datablob::DataBlobSource::~DataBlobSource(this);
        operator_delete(this);
      }
      stream->stream = (DataBlobSource *)0x0;
    }
    if (stream != (hrgls_DataBlobSource)0x0) {
      hrgls_DataBlobSource_::~hrgls_DataBlobSource_(stream);
      operator_delete(stream);
    }
  }
  return local_14;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceDestroy(hrgls_DataBlobSource stream)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!stream) {
      s = hrgls_STATUS_DELETE_OF_NULL_POINTER;
    } else {
      if (!stream->stream) {
        s = hrgls_STATUS_DELETE_OF_NULL_POINTER;
      } else {
        try {
          delete stream->stream;
        } catch (...) {
          s = hrgls_STATUS_DELETION_FAILED;
        }
        stream->stream = nullptr;
      }
      try {
        delete stream;
      } catch (...) {
        s = hrgls_STATUS_DELETION_FAILED;
      }
    }
    return s;
  }